

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
llvm::MemoryBuffer::getFileOrSTDIN
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,Twine *Filename,int64_t FileSize,bool RequiresNullTerminator)

{
  StringRef SVar1;
  SmallString<256U> NameBuf;
  SmallVectorImpl<char> local_138;
  undefined1 local_128 [256];
  
  local_138.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_138.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  local_138.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_128;
  SVar1 = Twine::toStringRef(Filename,&local_138);
  if ((SVar1.Length == 1) && (*SVar1.Data == '-')) {
    getSTDIN();
  }
  else {
    getFileAux<llvm::MemoryBuffer>
              (__return_storage_ptr__,Filename,FileSize,FileSize,0,RequiresNullTerminator,false);
  }
  if ((undefined1 *)
      local_138.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_128) {
    free(local_138.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<std::unique_ptr<MemoryBuffer>>
MemoryBuffer::getFileOrSTDIN(const Twine &Filename, int64_t FileSize,
                             bool RequiresNullTerminator) {
  SmallString<256> NameBuf;
  StringRef NameRef = Filename.toStringRef(NameBuf);

  if (NameRef == "-")
    return getSTDIN();
  return getFile(Filename, FileSize, RequiresNullTerminator);
}